

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputCheck.h
# Opt level: O2

int InputCheck(string *getLevelNumber)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = std::operator==(getLevelNumber,"exit");
  if (!bVar1) {
    iVar2 = atoi((getLevelNumber->_M_dataplus)._M_p);
    return iVar2;
  }
  exit(1);
}

Assistant:

int InputCheck(std::string getLevelNumber)
{
    int Number = 0;
    if (getLevelNumber == "exit") {
        exit(1);
    }
    if (atoi(getLevelNumber.c_str()) == 0) {

        return 0;
    }
    Number = atoi(getLevelNumber.c_str()); //

    return Number;
}